

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astBreakNode_primitiveMacro
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  anon_struct_16_2_e57137d2 gcFrame;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  gcFrame.sourcePosition = 0;
  gcFrame.result = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 2;
  local_30 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_48);
  gcFrame.sourcePosition = sysbvm_macroContext_getSourcePosition(*arguments);
  gcFrame.result = sysbvm_astBreakNode_create(context,gcFrame.sourcePosition);
  sysbvm_stackFrame_popRecord(&local_48);
  return gcFrame.result;
}

Assistant:

static sysbvm_tuple_t sysbvm_astBreakNode_primitiveMacro(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t *macroContext = &arguments[0];

    struct {
        sysbvm_tuple_t sourcePosition;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.sourcePosition = sysbvm_macroContext_getSourcePosition(*macroContext);
    gcFrame.result = sysbvm_astBreakNode_create(context, gcFrame.sourcePosition);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}